

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_gesture.cpp
# Opt level: O0

void Am_Gesture_Start_Do_proc(Am_Object *inter)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *value;
  Am_Object local_48;
  Am_Object local_40;
  Am_Point_List local_38 [2];
  Am_Object local_18;
  Am_Object feedback;
  Am_Object *inter_local;
  
  feedback.data = (Am_Object_Data *)inter;
  Am_Object::Am_Object(&local_18);
  pAVar2 = Am_Object::Get(inter,0xdc,0);
  Am_Object::operator=(&local_18,pAVar2);
  bVar1 = Am_Object::Valid(&local_18);
  if (bVar1) {
    pAVar2 = Am_Object::Get(inter,0xb2,0);
    Am_Point_List::Am_Point_List(local_38,pAVar2);
    value = Am_Point_List::operator_cast_to_Am_Wrapper_(local_38);
    Am_Object::Set(&local_18,0xb2,value,0);
    Am_Point_List::~Am_Point_List(local_38);
    Am_Check_And_Fix_Feedback_Group(&local_40,&local_18);
    Am_Object::~Am_Object(&local_40);
    Am_Object::Set(&local_18,0x69,true,0);
    Am_Object::Am_Object(&local_48,&local_18);
    Am_To_Top(&local_48);
    Am_Object::~Am_Object(&local_48);
  }
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Gesture_Start_Do, (Am_Object inter))
{
  Am_Object feedback;
  feedback = inter.Get(Am_FEEDBACK_OBJECT);
  if (feedback.Valid()) {
    feedback.Set(Am_POINT_LIST, (Am_Point_List)inter.Get(Am_POINT_LIST));
    //move feedback object to new group if necessary
    Am_Check_And_Fix_Feedback_Group(feedback, inter);
    feedback.Set(Am_VISIBLE, true);
    Am_To_Top(feedback);
#ifdef DEBUG
    if (Am_Inter_Tracing(Am_INTER_TRACE_SETTING))
      Am_Report_Set_Vis(inter, feedback, true);
#endif
  }
}